

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O0

void massage_linblk(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  long in_RSI;
  int in_R8D;
  int i;
  Symbol *s;
  Item *qs;
  int in_stack_00000104;
  Item *in_stack_00000108;
  int in_stack_00000114;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int is_nrnglobal;
  Item *in_stack_ffffffffffffffc8;
  Item *in_stack_ffffffffffffffd0;
  
  nlineq = nlineq + 1;
  if (nlineq == 0) {
    diag((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
         (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  sprintf(buf,"static void %s();\n",*(undefined8 *)(*(long *)(in_RSI + 8) + 0x48));
  linsertstr((List *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  replacstr((Item *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  insertstr((Item *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  insertstr((Item *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  linblk->subtype = linblk->subtype | 0x10000;
  (linblk->u).i = numlist;
  for (is_nrnglobal = 0x41; is_nrnglobal < 0x7b; is_nrnglobal = is_nrnglobal + 1) {
    for (in_stack_ffffffffffffffd0 = symlist[is_nrnglobal]->next;
        in_stack_ffffffffffffffd0 != symlist[is_nrnglobal];
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0->next) {
      in_stack_ffffffffffffffc8 = (in_stack_ffffffffffffffd0->element).itm;
      if (((in_stack_ffffffffffffffc8->itemtype == 0x13e) &&
          (((ulong)(in_stack_ffffffffffffffc8->element).itm & 0x10) != 0)) &&
         (*(int *)&in_stack_ffffffffffffffc8[1].next != 0)) {
        if (in_R8D != 0) {
          add_sens_statelist((Symbol *)0x120b46);
        }
        *(undefined4 *)&in_stack_ffffffffffffffc8[1].next = 0;
      }
    }
  }
  if (using_array == 0) {
    if (nlineq != nstate) {
      sprintf(buf,"Number states, %d, unequal to equations, %d in ",(ulong)(uint)nstate,
              (ulong)(uint)nlineq);
      diag((char *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
           (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  else {
    sprintf(buf,
            "if(_counte != %d) printf( \"Number of equations, %%d, does not equal number of states, %d\", _counte + 1);\n"
            ,(ulong)(nstate - 1),(ulong)(uint)nstate);
    insertstr((Item *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
              (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  linblk->used = nstate;
  sprintf(buf,"static double **_coef%d;\n",(ulong)(uint)numlist);
  linsertstr((List *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  sprintf(buf,"_slist%d",(ulong)(uint)numlist);
  add_global_var((char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,is_nrnglobal,
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  sprintf(buf,"\n#define _RHS%d(arg) _coef%d[arg][%d]\n",(ulong)(uint)numlist,(ulong)(uint)numlist,
          (ulong)(uint)nstate);
  linsertstr((List *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  sprintf(buf,"if (_first) _coef%d = makematrix(%d, %d);\n",(ulong)(uint)numlist,(ulong)(uint)nstate
          ,(ulong)(nstate + 1));
  lappendstr((List *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  sprintf(buf,"zero_matrix(_coef%d, %d, %d);\n{\n",(ulong)(uint)numlist,(ulong)(uint)nstate,
          (ulong)(nstate + 1));
  insertstr((Item *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  insertstr((Item *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  movelist((Item *)CONCAT44(is_nrnglobal,in_stack_ffffffffffffffc0),
           (Item *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(List *)0x120d9c);
  if (in_R8D != 0) {
    sensmassage(in_stack_00000114,in_stack_00000108,in_stack_00000104);
  }
  nstate = 0;
  nlineq = 0;
  return;
}

Assistant:

void massage_linblk(q1, q2, q3, q4, sensused) /* LINEAR NAME stmtlist '}' */
	Item *q1, *q2, *q3, *q4;
	int sensused;
{
	Item *qs;
	Symbol *s;
	int i;
	
#if LINT
assert(q2);
#endif
	if (++nlineq == 0) {
		diag(linblk->name, " has no equations");
	}
	Sprintf(buf, "static void %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic void"); Insertstr(q3, "()\n");
	Insertstr(q3->next, " int _counte = -1;\n");
	linblk->subtype |= LINF;
	linblk->u.i = numlist;
	SYMITER(NAME){
		if ((s->subtype &STAT) && s->used) {
			if (sensused) {
				add_sens_statelist(s);
			}
			s->used = 0;
		}
	}
	if (!using_array) {
		if (nlineq != nstate) {
Sprintf(buf,"Number states, %d, unequal to equations, %d in ", nstate, nlineq);
			diag(buf, linblk->name);
		}
	} else {
#if 1	/* can give message when running */
Sprintf(buf, "if(_counte != %d) printf( \"Number of equations, %%d,\
 does not equal number of states, %d\", _counte + 1);\n",
			nstate-1, nstate);
		Insertstr(q4, buf);
#endif
	}
	linblk->used = nstate;
	Sprintf(buf, "static double **_coef%d;\n", numlist);
	Linsertstr(procfunc, buf);

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, nstate*(1 + sens_parm), 1);

	Sprintf(buf, "\n#define _RHS%d(arg) _coef%d[arg][%d]\n",
		numlist, numlist, nstate);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "if (_first) _coef%d = makematrix(%d, %d);\n",
		numlist, nstate, nstate+1);
	Lappendstr(initlist, buf);
	Sprintf(buf, "zero_matrix(_coef%d, %d, %d);\n{\n",
		numlist, nstate, nstate+1);
	Insertstr(q3->next, buf);
	Insertstr(q4, "\n}\n");
	movelist(q1, q4, procfunc);
	if (sensused) {
		sensmassage(LINEAR, q2, numlist);
	}
	nstate = 0; nlineq = 0;
}